

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void get_ss_esp_from_tss(CPUX86State *env,uint32_t *ss_ptr,uint32_t *esp_ptr,int dpl,
                        uintptr_t retaddr)

{
  target_ulong tVar1;
  int iVar2;
  uint32_t uVar3;
  sbyte sVar4;
  uint uVar5;
  char *fmt;
  ulong uVar6;
  abi_ptr addr;
  CPUX86State *__mptr;
  long lStack_40;
  
  uVar5 = (env->tr).flags;
  if ((short)uVar5 < 0) {
    if ((uVar5 & 0x700) == 0x100) {
      uVar5 = uVar5 >> 0xb & 1;
      sVar4 = (sbyte)uVar5;
      if ((dpl * 4 + 6 << sVar4) - 1U <= (env->tr).limit) {
        uVar6 = (ulong)((dpl << 2 | 2U) << sVar4);
        addr = (env->tr).base + uVar6;
        iVar2 = cpu_mmu_index_kernel(env);
        if (uVar5 == 0) {
          uVar3 = cpu_lduw_mmuidx_ra_x86_64(env,addr,iVar2,retaddr);
          lStack_40 = 2;
        }
        else {
          uVar3 = cpu_ldl_mmuidx_ra_x86_64(env,addr,iVar2,retaddr);
          lStack_40 = 4;
        }
        *esp_ptr = uVar3;
        tVar1 = (env->tr).base;
        iVar2 = cpu_mmu_index_kernel(env);
        uVar3 = cpu_lduw_mmuidx_ra_x86_64(env,lStack_40 + uVar6 + tVar1,iVar2,retaddr);
        *ss_ptr = uVar3;
        return;
      }
      raise_exception_err_ra_x86_64(env,10,(env->tr).selector & 0xfffc,retaddr);
    }
    fmt = "invalid tss type";
  }
  else {
    fmt = "invalid tss";
  }
  cpu_abort_x86_64((CPUState *)(env[-6].mtrr_var + 4),fmt);
}

Assistant:

static inline void get_ss_esp_from_tss(CPUX86State *env, uint32_t *ss_ptr,
                                       uint32_t *esp_ptr, int dpl,
                                       uintptr_t retaddr)
{
    X86CPU *cpu = env_archcpu(env);
    int type, index, shift;

#if 0
    {
        int i;
        printf("TR: base=%p limit=%x\n", env->tr.base, env->tr.limit);
        for (i = 0; i < env->tr.limit; i++) {
            printf("%02x ", env->tr.base[i]);
            if ((i & 7) == 7) {
                printf("\n");
            }
        }
        printf("\n");
    }
#endif

    if (!(env->tr.flags & DESC_P_MASK)) {
        cpu_abort(CPU(cpu), "invalid tss");
    }
    type = (env->tr.flags >> DESC_TYPE_SHIFT) & 0xf;
    if ((type & 7) != 1) {
        cpu_abort(CPU(cpu), "invalid tss type");
    }
    shift = type >> 3;
    index = (dpl * 4 + 2) << shift;
    if (index + (4 << shift) - 1 > env->tr.limit) {
        raise_exception_err_ra(env, EXCP0A_TSS, env->tr.selector & 0xfffc, retaddr);
    }
    if (shift == 0) {
        *esp_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index, retaddr);
        *ss_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index + 2, retaddr);
    } else {
        *esp_ptr = cpu_ldl_kernel_ra(env, env->tr.base + index, retaddr);
        *ss_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index + 4, retaddr);
    }
}